

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestGroupUtil.hpp
# Opt level: O2

TestCaseGroup *
vkt::
createTestGroup<tcu::TestStatus(*)(vkt::Context&,vk::VkFormat,vk::VkImageType,vk::VkImageTiling)>
          (TestContext *testCtx,string *name,string *description,CreateChildrenFunc createChildren,
          _func_TestStatus_Context_ptr_VkFormat_VkImageType_VkImageTiling *arg0)

{
  TestGroupHelper1<tcu::TestStatus_(*)(vkt::Context_&,_vk::VkFormat,_vk::VkImageType,_vk::VkImageTiling)>
  *this;
  _func_TestStatus_Context_ptr_VkFormat_VkImageType_VkImageTiling *local_38;
  
  local_38 = arg0;
  this = (TestGroupHelper1<tcu::TestStatus_(*)(vkt::Context_&,_vk::VkFormat,_vk::VkImageType,_vk::VkImageTiling)>
          *)operator_new(0x80);
  TestGroupHelper1<tcu::TestStatus_(*)(vkt::Context_&,_vk::VkFormat,_vk::VkImageType,_vk::VkImageTiling)>
  ::TestGroupHelper1(this,testCtx,name,description,createChildren,&local_38);
  return &this->super_TestCaseGroup;
}

Assistant:

tcu::TestCaseGroup* createTestGroup (tcu::TestContext&										testCtx,
									 const std::string&										name,
									 const std::string&										description,
									 typename TestGroupHelper1<Arg0>::CreateChildrenFunc	createChildren,
									 Arg0													arg0)
{
	return new TestGroupHelper1<Arg0>(testCtx, name, description, createChildren, arg0);
}